

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O0

void dspl_Render(ECommand_t activeCmd)

{
  ECommand_t activeCmd_local;
  
  werase(_stdscr);
  DisplayColors(activeCmd);
  DisplayPack(activeCmd);
  DisplayDesk(activeCmd);
  DisplayFlying();
  DisplayStats();
  if (*Message != '\0') {
    DisplayMessage();
  }
  wrefresh(_stdscr);
  if (activeCmd == CMD_HELP) {
    DisplayHelp();
  }
  return;
}

Assistant:

void dspl_Render(ECommand_t activeCmd)
{
  erase();
  DisplayColors(activeCmd);
  DisplayPack(activeCmd);
  DisplayDesk(activeCmd);
  DisplayFlying();
  DisplayStats();

  if (Message[0] != '\0') {
    DisplayMessage();
  }

  refresh();
  if (activeCmd == CMD_HELP) {
    DisplayHelp();
  }
}